

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_rules.hpp
# Opt level: O2

void ovf::detail::parse::v2::ovf_segment_data_action<ovf::detail::parse::v2::check_value_bin_4>::
     apply<tao::pegtl::internal::action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>,double>
               (action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *in,ovf_file *f,ovf_segment *segment,double *data)

{
  parse_error *this;
  allocator local_59;
  string local_58;
  string bytes;
  
  tao::pegtl::internal::
  action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string(&bytes,in);
  if (*(int *)bytes._M_dataplus._M_p == 0x4996b438) {
    std::__cxx11::string::~string((string *)&bytes);
    return;
  }
  this = (parse_error *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string
            ((string *)&local_58,"the expected binary check value could not be parsed!",&local_59);
  tao::pegtl::parse_error::
  parse_error<tao::pegtl::internal::action_input<tao::pegtl::memory_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf,std::__cxx11::string>>>
            (this,&local_58,in);
  __cxa_throw(this,&tao::pegtl::parse_error::typeinfo,tao::pegtl::parse_error::~parse_error);
}

Assistant:

static void apply( const Input& in, ovf_file & f, const ovf_segment & segment, scalar * data )
            {
                std::string bytes = in.string();
                uint32_t hex_4b = endian::from_little_32(reinterpret_cast<const uint8_t *>( bytes.c_str() ));

                if( hex_4b != check::val_4b )
                    throw tao::pegtl::parse_error( "the expected binary check value could not be parsed!", in );
            }